

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O2

UINT32 SignData(TSS_DEVICE *tpm,TSS_SESSION *sess,BYTE *tokenData,UINT32 tokenSize,
               BYTE *signatureBuffer,UINT32 sigBufSize)

{
  TPMI_DH_OBJECT sequenceHandle;
  UINT32 dataSize;
  TPM_RC TVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar6;
  TPMI_DH_OBJECT hSeq;
  BYTE *local_88;
  ulong local_80;
  TPM2B_DIGEST digest;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if (sigBufSize < 0x20) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x20;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
              ,"SignData",0x139,1,"Signature buffer size (%uz) is less than required size (%uz)",
              CONCAT44(uVar6,sigBufSize),0x20);
    return 0x20;
  }
  local_88 = signatureBuffer;
  dataSize = TSS_GetTpmProperty(tpm,0x10d);
  if (dataSize < tokenSize) {
    hSeq = 0x40000007;
    TVar1 = TPM2_HMAC_Start(tpm,sess,0x81000100,(TPM2B_AUTH *)0x0,0xb,&hSeq);
    sequenceHandle = hSeq;
    if (TVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0;
      }
      pcVar3 = TSS_StatusValueName(TVar1);
      pcVar5 = "Failed to start HMAC sequence %s";
      iVar4 = 0x149;
LAB_001098d9:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"SignData",iVar4,1,pcVar5,pcVar3);
      return 0;
    }
    local_80 = (ulong)dataSize;
    do {
      TVar1 = TSS_SequenceUpdate(tpm,sess,sequenceHandle,tokenData,dataSize);
      if (TVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0;
        }
        pcVar3 = TSS_StatusValueName(TVar1);
        pcVar5 = "Failed to update HMAC sequence %s";
        iVar4 = 0x156;
        goto LAB_001098d9;
      }
      tokenSize = tokenSize - dataSize;
      tokenData = tokenData + local_80;
    } while (dataSize < tokenSize);
    TVar1 = TSS_SequenceComplete(tpm,sess,sequenceHandle,tokenData,tokenSize,&digest);
    if (TVar1 == 0) {
LAB_00109879:
      MemoryCopy(local_88,digest.t.buffer,0x20);
      return 0x20;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0;
    }
    pcVar3 = TSS_StatusValueName(TVar1);
    pcVar5 = "Failed to complete HMAC sequence %s";
    iVar4 = 0x164;
  }
  else {
    TVar1 = TSS_HMAC(tpm,sess,0x81000100,tokenData,tokenSize,&digest);
    if (TVar1 == 0) goto LAB_00109879;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0;
    }
    pcVar3 = TSS_StatusValueName(TVar1);
    pcVar5 = "Hashing token data failed %s";
    iVar4 = 0x179;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
            ,"SignData",iVar4,1,pcVar5,pcVar3);
  return 0;
}

Assistant:

UINT32 SignData(TSS_DEVICE* tpm, TSS_SESSION* sess, BYTE* tokenData, UINT32 tokenSize, BYTE* signatureBuffer, UINT32 sigBufSize)
{
    UINT32 result;
    TPM_RC          rc;
    TPM2B_DIGEST    digest;
    TPM_ALG_ID      idKeyHashAlg = ALG_SHA256_VALUE;
    UINT32          sigSize = TSS_GetDigestSize(idKeyHashAlg); //32
    UINT32          MaxInputBuffer = 0;

    if (sigBufSize < sigSize)
    {
        LogError("Signature buffer size (%uz) is less than required size (%uz)", sigBufSize, sigSize);
        result = sigSize;
    }
    else
    {
        sigBufSize = 0;
        MaxInputBuffer = TSS_GetTpmProperty(tpm, TPM_PT_INPUT_BUFFER); // 1024
        if (tokenSize > MaxInputBuffer) // 68
        {
            TPMI_DH_OBJECT  hSeq = TPM_RH_NULL;
            BYTE           *curPos = tokenData;
            UINT32          bytesLeft = tokenSize;

            rc = TPM2_HMAC_Start(tpm, sess, DPS_ID_KEY_HANDLE, NULL, idKeyHashAlg, &hSeq);
            if (rc != TPM_RC_SUCCESS)
            {
                LogError("Failed to start HMAC sequence %s", TSS_StatusValueName(rc) );
                result = 0;
            }
            else
            {
                bool seq_complete = true;
                // Above condition 'if (tokenSize > MaxInputBuffer)' ensures that the first
                // iteration is always valid.
                do
                {
                    rc = TSS_SequenceUpdate(tpm, sess, hSeq, curPos, MaxInputBuffer);
                    if (rc != TPM_RC_SUCCESS)
                    {
                        LogError("Failed to update HMAC sequence %s", TSS_StatusValueName(rc));
                        seq_complete = false;
                        break;
                    }

                    bytesLeft -= MaxInputBuffer;
                    curPos += MaxInputBuffer;
                } while (bytesLeft > MaxInputBuffer);

                if (seq_complete)
                {
                    rc = TSS_SequenceComplete(tpm, sess, hSeq, curPos, bytesLeft, &digest);
                    if (rc != TPM_RC_SUCCESS)
                    {
                        LogError("Failed to complete HMAC sequence %s", TSS_StatusValueName(rc));
                        result = 0;
                    }
                    else
                    {
                        MemoryCopy(signatureBuffer, digest.t.buffer, sigSize);
                        sigBufSize = sigSize;
                        result = sigBufSize;
                    }
                }
                else
                {
                    result = 0;
                }
            }
        }
        else
        {
            rc = TSS_HMAC(tpm, sess, DPS_ID_KEY_HANDLE, tokenData, tokenSize, &digest);
            if (rc != TPM_RC_SUCCESS)
            {
                LogError("Hashing token data failed %s", TSS_StatusValueName(rc));
                result = 0;
            }
            else
            {
                MemoryCopy(signatureBuffer, digest.t.buffer, sigSize);
                sigBufSize = sigSize;
                result = sigBufSize;
            }
        }
    }
    return result;
}